

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.h
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestPartResult
          (PrettyUnitTestResultPrinter *this,TestPartResult *result)

{
  Message *pMVar1;
  int in_ECX;
  pointer *__ptr;
  internal *this_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  pointer local_60;
  char *local_58;
  string local_50;
  string local_30;
  
  if ((result->type_ != kSuccess) && (result->type_ != kSkip)) {
    Message::Message((Message *)&local_68);
    this_00 = (internal *)(result->file_name_)._M_string_length;
    if (this_00 != (internal *)0x0) {
      this_00 = (internal *)(result->file_name_)._M_dataplus._M_p;
    }
    FormatFileLocation_abi_cxx11_
              (&local_30,this_00,(char *)(ulong)(uint)result->line_number_,in_ECX);
    std::operator<<((ostream *)(local_68._M_head_impl + 0x10),(string *)&local_30);
    std::operator<<((ostream *)(local_68._M_head_impl + 0x10)," ");
    if ((ulong)result->type_ < 4) {
      local_58 = &DAT_001ced88 + *(int *)(&DAT_001ced88 + (ulong)result->type_ * 4);
    }
    else {
      local_58 = "Unknown result type";
    }
    pMVar1 = Message::operator<<((Message *)&local_68,&local_58);
    local_60 = (result->message_)._M_dataplus._M_p;
    pMVar1 = Message::operator<<(pMVar1,&local_60);
    Message::GetString_abi_cxx11_(&local_50,pMVar1);
    std::__cxx11::string::_M_dispose();
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    puts(local_50._M_dataplus._M_p);
    fflush(_stdout);
    std::__cxx11::string::_M_dispose();
    fflush(_stdout);
  }
  return;
}

Assistant:

Type type() const { return type_; }